

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_tree.cpp
# Opt level: O3

BalanceInfo si9ma::BinaryTree::is_balance_tree(TreeNode *head)

{
  uint uVar1;
  int iVar2;
  BalanceInfo BVar3;
  BalanceInfo BVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  
  if (head == (TreeNode *)0x0) {
    uVar5 = 0;
    uVar6 = 1;
  }
  else {
    BVar3 = is_balance_tree(head->left);
    BVar4 = is_balance_tree(head->right);
    iVar8 = BVar3.height;
    iVar2 = BVar4.height;
    uVar7 = iVar8 - iVar2;
    if (uVar7 != 0 && iVar2 <= iVar8) {
      iVar2 = iVar8;
    }
    uVar5 = (ulong)(iVar2 + 1);
    if ((((ulong)BVar3 & 1) == 0) || (((ulong)BVar4 & 1) == 0)) {
      uVar6 = 0;
    }
    else {
      uVar1 = -uVar7;
      if (0 < (int)uVar7) {
        uVar1 = uVar7;
      }
      uVar6 = (ulong)(uVar1 < 2);
    }
  }
  return (BalanceInfo)(uVar5 << 0x20 | uVar6);
}

Assistant:

BalanceInfo BinaryTree::is_balance_tree(const TreeNode *head) {
        if (head == nullptr)
            return BalanceInfo{true,0};

        BalanceInfo res;
        auto left_info = is_balance_tree(head->left);
        auto right_info = is_balance_tree(head->right);

        res.height = max(left_info.height,right_info.height) + 1;
        res.is_balance = left_info.is_balance && right_info.is_balance && (abs(left_info.height - right_info.height) < 2);

        return res;
    }